

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  BYTE *s;
  uint8_t *puVar9;
  BYTE *pBVar10;
  uint uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  BYTE *pBVar14;
  BYTE *__src;
  BYTE *d_2;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *d;
  BYTE *pBVar18;
  ushort *puVar19;
  ushort *puVar20;
  uint uVar21;
  size_t sVar22;
  ulong uVar23;
  long local_50;
  int local_48;
  
  uVar13 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar13 == 0) {
    iVar8 = LZ4_decompress_fast(source,dest,originalSize);
joined_r0x00113397:
    if (iVar8 < 1) {
      return iVar8;
    }
    LZ4_streamDecode->table[3] = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (uint8_t *)(dest + originalSize);
    return iVar8;
  }
  local_50 = (long)originalSize;
  puVar9 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  if (puVar9 != (uint8_t *)dest) {
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar13;
    (LZ4_streamDecode->internal_donotuse).externalDict = puVar9 + -uVar13;
    iVar8 = LZ4_decompress_fast_extDict(source,dest,originalSize,puVar9 + -uVar13,uVar13);
    goto joined_r0x00113397;
  }
  if ((uVar13 < 0xffff) && (LZ4_streamDecode->table[1] != 0)) {
    if (source == (char *)0x0) {
      return -1;
    }
    puVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + LZ4_streamDecode->table[1];
    if ((LZ4_streamDecode->internal_donotuse).externalDict == (uint8_t *)0x0) {
      puVar12 = (uint8_t *)0x0;
    }
    if (originalSize == 0) {
      if (*source != '\0') {
        return -1;
      }
      local_48 = 1;
      local_50 = 0;
      goto LAB_0011344d;
    }
    __src = (BYTE *)(dest + -uVar13);
    pBVar1 = (BYTE *)(dest + local_50);
    local_48 = (int)source;
    pBVar18 = (BYTE *)dest;
    if (originalSize < 0x40) goto LAB_00113710;
LAB_00113489:
    bVar3 = (byte)*(ushort *)source;
    uVar11 = (uint)bVar3;
    uVar21 = (uint)(bVar3 >> 4);
    if (uVar21 == 0xf) {
      uVar21 = 0;
      puVar20 = (ushort *)((long)source + 0x10);
      do {
        puVar19 = puVar20;
        uVar21 = uVar21 + *(byte *)((long)puVar19 + -0xf);
        puVar20 = (ushort *)((long)puVar19 + 1);
      } while (*(byte *)((long)puVar19 + -0xf) == 0xff);
      uVar13 = (ulong)uVar21;
      pBVar15 = pBVar18 + uVar13 + 0xf;
      if (dest + local_50 + -8 < pBVar15) {
        sVar22 = uVar13 + 0xf;
        source = (char *)(puVar19 + -7);
        goto LAB_0011374f;
      }
      puVar20 = puVar19 + -7;
      do {
        *(undefined8 *)pBVar18 = *(undefined8 *)puVar20;
        pBVar18 = pBVar18 + 8;
        puVar20 = puVar20 + 4;
      } while (pBVar18 < pBVar15);
      puVar20 = (ushort *)((long)puVar19 + 1 + uVar13);
    }
    else {
      *(undefined8 *)pBVar18 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pBVar18 + 8) = *(undefined8 *)((long)source + 9);
      }
      pBVar15 = pBVar18 + uVar21;
      puVar20 = (ushort *)((byte *)((long)source + 1) + uVar21);
    }
    uVar7 = *puVar20;
    uVar13 = (ulong)uVar7;
    uVar21 = (uint)uVar7;
    source = (char *)(puVar20 + 1);
    pBVar16 = pBVar15 + -uVar13;
    uVar23 = (ulong)(bVar3 & 0xf);
    if (uVar23 == 0xf) {
      uVar11 = 0;
      do {
        uVar6 = *(ushort *)source;
        source = (char *)((long)source + 1);
        uVar11 = uVar11 + (byte)uVar6;
      } while ((byte)uVar6 == 0xff);
      sVar22 = (ulong)uVar11 + 0x13;
      if (pBVar1 + -0x40 <= pBVar15 + (ulong)uVar11 + 0x13) goto LAB_001137a8;
    }
    else {
      sVar22 = uVar23 + 4;
      if (pBVar1 + -0x40 <= pBVar15 + uVar23 + 4) goto LAB_001137a8;
      if ((__src <= pBVar16) && (7 < uVar7)) {
        *(undefined8 *)pBVar15 = *(undefined8 *)pBVar16;
        *(undefined8 *)(pBVar15 + 8) = *(undefined8 *)(pBVar16 + 8);
        *(undefined2 *)(pBVar15 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
        pBVar18 = pBVar15 + uVar23 + 4;
        goto LAB_00113489;
      }
    }
    pBVar2 = pBVar15 + sVar22;
    pBVar18 = pBVar2;
    if (__src <= pBVar16) {
      if (uVar7 < 0x10) {
        LZ4_memcpy_using_offset(pBVar15,pBVar16,pBVar2,uVar13);
      }
      else {
        do {
          uVar5 = *(undefined8 *)(pBVar15 + -uVar13 + 8);
          *(undefined8 *)pBVar15 = *(undefined8 *)(pBVar15 + -uVar13);
          *(undefined8 *)(pBVar15 + 8) = uVar5;
          uVar5 = *(undefined8 *)(pBVar15 + -uVar13 + 0x10 + 8);
          *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(pBVar15 + -uVar13 + 0x10);
          *(undefined8 *)(pBVar15 + 0x18) = uVar5;
          pBVar15 = pBVar15 + 0x20;
        } while (pBVar15 < pBVar2);
      }
      goto LAB_00113489;
    }
    if (pBVar2 <= pBVar1 + -5) {
      uVar13 = (long)__src - (long)pBVar16;
      uVar23 = sVar22 - uVar13;
      if (sVar22 < uVar13 || uVar23 == 0) {
        memmove(pBVar15,puVar12 + -uVar13,sVar22);
      }
      else {
        memcpy(pBVar15,puVar12 + -uVar13,uVar13);
        pBVar18 = pBVar15 + uVar13;
        pBVar15 = __src;
        if ((ulong)((long)pBVar18 - (long)__src) < uVar23) {
          for (; pBVar18 < pBVar2; pBVar18 = pBVar18 + 1) {
            *pBVar18 = *pBVar15;
            pBVar15 = pBVar15 + 1;
          }
        }
        else {
          memcpy(pBVar18,__src,uVar23);
          pBVar18 = pBVar2;
        }
      }
      goto LAB_00113489;
    }
    goto LAB_001138ad;
  }
  local_48 = LZ4_decompress_fast(source,dest,originalSize);
  goto LAB_00113440;
LAB_001137a8:
  pBVar2 = pBVar15 + sVar22;
  pBVar18 = pBVar2;
  if (pBVar16 < __src) {
    if (pBVar1 + -5 < pBVar2) goto LAB_001138ad;
    uVar13 = (long)__src - (long)pBVar16;
    uVar23 = sVar22 - uVar13;
    if (sVar22 < uVar13 || uVar23 == 0) {
      memmove(pBVar15,puVar12 + -uVar13,sVar22);
    }
    else {
      memcpy(pBVar15,puVar12 + -uVar13,uVar13);
      pBVar18 = pBVar15 + uVar13;
      pBVar15 = __src;
      if ((ulong)((long)pBVar18 - (long)__src) < uVar23) {
        for (; pBVar18 < pBVar2; pBVar18 = pBVar18 + 1) {
          *pBVar18 = *pBVar15;
          pBVar15 = pBVar15 + 1;
        }
      }
      else {
        memcpy(pBVar18,__src,uVar23);
        pBVar18 = pBVar2;
      }
    }
  }
  else {
    if (uVar21 < 8) {
      pBVar15[0] = '\0';
      pBVar15[1] = '\0';
      pBVar15[2] = '\0';
      pBVar15[3] = '\0';
      *pBVar15 = *pBVar16;
      pBVar15[1] = pBVar16[1];
      pBVar15[2] = pBVar16[2];
      pBVar15[3] = pBVar16[3];
      uVar13 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar21 << 2));
      *(undefined4 *)(pBVar15 + 4) = *(undefined4 *)(pBVar16 + uVar13);
      pBVar16 = pBVar16 + (uVar13 - (long)*(int *)((long)dec64table + (ulong)(uVar21 << 2)));
    }
    else {
      *(undefined8 *)pBVar15 = *(undefined8 *)pBVar16;
      pBVar16 = pBVar16 + 8;
    }
    pBVar10 = pBVar15 + 8;
    if (pBVar1 + -0xc < pBVar2) {
      if (pBVar1 + -5 < pBVar2) goto LAB_001138ad;
      pBVar15 = pBVar1 + -7;
      pBVar14 = pBVar16;
      pBVar17 = pBVar10;
      if (pBVar10 < pBVar15) {
        do {
          *(undefined8 *)pBVar17 = *(undefined8 *)pBVar14;
          pBVar17 = pBVar17 + 8;
          pBVar14 = pBVar14 + 8;
        } while (pBVar17 < pBVar15);
        pBVar16 = pBVar16 + ((long)pBVar15 - (long)pBVar10);
        pBVar10 = pBVar15;
      }
      for (; pBVar10 < pBVar2; pBVar10 = pBVar10 + 1) {
        BVar4 = *pBVar16;
        pBVar16 = pBVar16 + 1;
        *pBVar10 = BVar4;
      }
    }
    else {
      *(undefined8 *)pBVar10 = *(undefined8 *)pBVar16;
      if (0x10 < sVar22) {
        pBVar15 = pBVar15 + 0x10;
        do {
          pBVar16 = pBVar16 + 8;
          *(undefined8 *)pBVar15 = *(undefined8 *)pBVar16;
          pBVar15 = pBVar15 + 8;
        } while (pBVar15 < pBVar2);
      }
    }
  }
LAB_00113710:
  while( true ) {
    uVar7 = *(ushort *)source;
    uVar11 = (uint)(byte)uVar7;
    source = (char *)((long)source + 1);
    uVar21 = (uint)(byte)((byte)uVar7 >> 4);
    sVar22 = (size_t)uVar21;
    if ((0x8f < uVar11) || (dest + local_50 + -0x1a < pBVar18)) break;
    *(undefined8 *)pBVar18 = *(undefined8 *)source;
    pBVar15 = pBVar18 + sVar22;
    uVar13 = (ulong)(uVar11 & 0xf);
    puVar20 = (ushort *)((long)source + sVar22);
    source = (char *)(puVar20 + 1);
    uVar7 = *puVar20;
    pBVar16 = pBVar15 + -(ulong)uVar7;
    if (((uVar13 == 0xf) || (uVar7 < 8)) || (pBVar16 < __src)) goto LAB_00113786;
    *(undefined8 *)pBVar15 = *(undefined8 *)pBVar16;
    *(undefined8 *)(pBVar15 + 8) = *(undefined8 *)(pBVar16 + 8);
    *(undefined2 *)(pBVar15 + 0x10) = *(undefined2 *)(pBVar16 + 0x10);
    pBVar18 = pBVar15 + uVar13 + 4;
  }
  if (uVar21 == 0xf) {
    uVar21 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar21 = uVar21 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    sVar22 = (ulong)uVar21 + 0xf;
  }
  pBVar15 = pBVar18 + sVar22;
LAB_0011374f:
  puVar20 = (ushort *)source;
  if (dest + local_50 + -8 < pBVar15) goto LAB_001138a8;
  do {
    *(undefined8 *)pBVar18 = *(undefined8 *)puVar20;
    pBVar18 = pBVar18 + 8;
    puVar20 = puVar20 + 4;
  } while (pBVar18 < pBVar15);
  puVar20 = (ushort *)((long)source + sVar22);
  source = (char *)(puVar20 + 1);
  uVar7 = *puVar20;
  pBVar16 = pBVar15 + -(ulong)uVar7;
  uVar13 = (ulong)(uVar11 & 0xf);
LAB_00113786:
  uVar21 = (uint)uVar7;
  if ((int)uVar13 == 0xf) {
    uVar11 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar11 = uVar11 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar13 = (ulong)uVar11 + 0xf;
  }
  sVar22 = uVar13 + 4;
  goto LAB_001137a8;
LAB_001138a8:
  if (pBVar15 == pBVar1) {
    memmove(pBVar18,source,sVar22);
    local_48 = ((int)source + (int)sVar22) - local_48;
  }
  else {
LAB_001138ad:
    local_48 = ~(uint)source + local_48;
  }
LAB_00113440:
  if (local_48 < 1) {
    return local_48;
  }
  puVar9 = (LZ4_streamDecode->internal_donotuse).prefixEnd;
  uVar13 = LZ4_streamDecode->table[3];
LAB_0011344d:
  LZ4_streamDecode->table[3] = uVar13 + local_50;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = puVar9 + local_50;
  return local_48;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        if (lz4sd->prefixSize >= 64 KB - 1 || lz4sd->extDictSize == 0)
            result = LZ4_decompress_fast(source, dest, originalSize);
        else
            result = LZ4_decompress_fast_doubleDict(source, dest, originalSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}